

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_non_smooth.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint local_8c;
  uint local_88;
  uint global_iteration;
  uint k;
  uint j;
  uint i;
  uint P_RHO_VALUES_SIZE;
  double p_rho_values [3];
  undefined8 uStack_58;
  uint ETA_VALUES_SIZE;
  double eta_values [3];
  undefined8 uStack_38;
  uint MU_VALUES_SIZE;
  double mu_values [3];
  char **argv_local;
  int argc_local;
  
  uStack_38 = 0x3fb999999999999a;
  mu_values[0] = 0.01;
  mu_values[1] = 0.001;
  eta_values[2]._4_4_ = 3;
  uStack_58 = 0x3fb999999999999a;
  eta_values[0] = 1.0;
  eta_values[1] = 10.0;
  p_rho_values[2]._4_4_ = 3;
  _i = 0x3ff0000000000000;
  p_rho_values[0] = 10.0;
  p_rho_values[1] = 100.0;
  local_8c = 0;
  for (k = 0; k < 3; k = k + 1) {
    for (global_iteration = 0; global_iteration < 3; global_iteration = global_iteration + 1) {
      for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
        test_iteration(*(double *)((long)&stack0xffffffffffffffc8 + (ulong)k * 8),
                       *(double *)(&i + (ulong)global_iteration * 2),
                       *(double *)((long)&stack0xffffffffffffffa8 + (ulong)local_88 * 8),local_8c,
                       argc,argv);
        local_8c = local_8c + 1;
      }
    }
  }
  return 0;
}

Assistant:

int main (int argc, char * argv[])
{
  double mu_values[] = {.1, .01, .001};
  const unsigned MU_VALUES_SIZE = 3;
  double eta_values[] = {.1, 1., 10.};
  const unsigned ETA_VALUES_SIZE = 3;
  double p_rho_values[] = {1., 10., 100.};
  const unsigned P_RHO_VALUES_SIZE = 3;

  unsigned i = 0, 
           j = 0, 
           k = 0, 
           global_iteration = 0;

  for (i = 0; i < MU_VALUES_SIZE; ++i) {
    for (j = 0; j < P_RHO_VALUES_SIZE; ++j) {
      for (k = 0; k < ETA_VALUES_SIZE; ++k) {
        test_iteration (mu_values[i], p_rho_values[j], eta_values[k], global_iteration, argc, argv);
        global_iteration += 1;
      }
    }
  }

  return 0;
}